

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O2

void __thiscall
cfgfile::generator::cfg::tag_field_t::on_finish
          (tag_field_t *this,parser_info_t<cfgfile::string_trait_t> *info)

{
  string_t *type;
  bool bVar1;
  field_type_t fVar2;
  exception_t<cfgfile::string_trait_t> *this_00;
  allocator local_181;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  type = &(this->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>
          .m_name;
  fVar2 = field_type_from_string(type);
  if ((fVar2 < custom_tag_field_type) && ((0x1aU >> (fVar2 & 0x1f) & 1) != 0)) {
    bVar1 = tag_t<cfgfile::string_trait_t>::is_defined
                      (&(this->m_value_type).super_tag_t<cfgfile::string_trait_t>);
    if (!bVar1) {
      this_00 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&local_140,"Undefined required tag \"",&local_181);
      std::operator+(&local_120,&local_140,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     c_value_type_tag_name_abi_cxx11_);
      std::operator+(&local_100,&local_120,"\" in tag \"");
      std::operator+(&local_e0,&local_100,type);
      std::operator+(&local_c0,&local_e0,"\". Line ");
      std::__cxx11::to_string(&local_160,info->m_line_number);
      std::operator+(&local_a0,&local_c0,&local_160);
      std::operator+(&local_80,&local_a0,", column ");
      std::__cxx11::to_string(&local_180,info->m_column_number);
      std::operator+(&local_60,&local_80,&local_180);
      std::operator+(&local_40,&local_60,".");
      exception_t<cfgfile::string_trait_t>::exception_t(this_00,&local_40);
      __cxa_throw(this_00,&exception_t<cfgfile::string_trait_t>::typeinfo,
                  exception_t<cfgfile::string_trait_t>::~exception_t);
    }
  }
  tag_no_value_t<cfgfile::string_trait_t>::on_finish
            (&this->super_tag_no_value_t<cfgfile::string_trait_t>,info);
  return;
}

Assistant:

void
tag_field_t::on_finish( const parser_info_t< cfgfile::string_trait_t > & info )
{
	switch( field_type_from_string( name() ) )
	{
		case field_t::scalar_field_type :
		case field_t::scalar_vector_field_type :
		case field_t::vector_of_tags_field_type :
		{
			if( !m_value_type.is_defined() )
				throw cfgfile::exception_t< cfgfile::string_trait_t >( std::string( "Undefined required "
						"tag \"" ) + c_value_type_tag_name +
					"\" in tag \"" + name() +
					"\". Line " + std::to_string( info.line_number() ) +
					", column " + std::to_string( info.column_number() ) + "." );
		}
			break;

		default :
			break;
	}

	cfgfile::tag_no_value_t<>::on_finish( info );
}